

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::FetchRow
          (UpdateSegment *this,TransactionData transaction,idx_t row_id,Vector *result,
          idx_t result_idx)

{
  idx_t iVar1;
  fetch_row_function_t p_Var2;
  UpdateInfo *pUVar3;
  ulong uVar4;
  StorageLockKey *pSVar5;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferReference pin;
  StorageLock SStack_78;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  uVar4 = row_id - this->column_data->start;
  pSVar5 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock(&SStack_78);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)&SStack_78);
  local_68 = GetUpdateNode(this,pSVar5,uVar4 >> 0xb);
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    iVar1 = this->column_data->start;
    SStack_78.internals.internal.
    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_idx;
    UndoBufferPointer::Pin(&local_58,&local_68);
    p_Var2 = this->fetch_row_function;
    pUVar3 = (UpdateInfo *)UndoBufferReference::Ptr(&local_58);
    (*p_Var2)(transaction.start_time,transaction.transaction_id,pUVar3,
              row_id - ((uVar4 & 0xfffffffffffff800) + iVar1),result,
              (idx_t)SStack_78.internals.internal.
                     super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
    BufferHandle::~BufferHandle(&local_58.handle);
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &SStack_78);
  return;
}

Assistant:

void UpdateSegment::FetchRow(TransactionData transaction, idx_t row_id, Vector &result, idx_t result_idx) {
	idx_t vector_index = (row_id - column_data.start) / STANDARD_VECTOR_SIZE;
	auto lock_handle = lock.GetSharedLock();
	auto entry = GetUpdateNode(*lock_handle, vector_index);
	if (!entry.IsSet()) {
		return;
	}
	idx_t row_in_vector = (row_id - column_data.start) - vector_index * STANDARD_VECTOR_SIZE;
	auto pin = entry.Pin();
	fetch_row_function(transaction.start_time, transaction.transaction_id, UpdateInfo::Get(pin), row_in_vector, result,
	                   result_idx);
}